

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_game.hpp
# Opt level: O1

void __thiscall PatchNewGame::alter_rom(PatchNewGame *this,ROM *rom)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Code *pCVar3;
  Code local_98;
  
  p_Var1 = &local_98._pending_branches._M_t._M_impl.super__Rb_tree_header;
  local_98._labels._M_t._M_impl._0_8_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl._0_8_ = 0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_98._labels._M_t._M_impl.super__Rb_tree_header;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pCVar3 = md::Code::nop(&local_98,4);
  md::ROM::set_code(rom,0x281a,pCVar3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_98._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98._pending_branches._M_t);
  if (local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98._labels._M_t._M_impl._0_8_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl._0_8_ = 0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pCVar3 = md::Code::nop(&local_98,5);
  md::ROM::set_code(rom,0x8dda,pCVar3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_98._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98._pending_branches._M_t);
  if (local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98._labels._M_t._M_impl._0_8_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl._0_8_ = 0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pCVar3 = md::Code::nop(&local_98,4);
  md::ROM::set_code(rom,0x8f6e,pCVar3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_98._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98._pending_branches._M_t);
  if (local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  md::ROM::set_byte(rom,0x8f76,'`');
  return;
}

Assistant:

void alter_rom(md::ROM& rom) override
    {
        // Usually, when starting a new game, it is automatically put into "cutscene mode" to
        // let the intro roll without allowing the player to move or pause, or do anything at all.
        // We need to remove that cutscene flag to enable the player actually playing the game.
        rom.set_code(0x281A, md::Code().nop(4));

        // Loading a save inside the map having the intro ID triggers the intro. That's not the kind
        // of behavior we want.
        rom.set_code(0x8DDA, md::Code().nop(5));

        // Load HUD tiles properly when loading inside intro map
        rom.set_code(0x8F6E, md::Code().nop(4));
        rom.set_byte(0x8F76, 0x60);
    }